

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkCecFraigPart(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int nPartSize,int fVerbose)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  uint uVar2;
  int *piVar3;
  Abc_Frame_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pNodeName;
  int *pSimInfo;
  int nOutputs;
  int Status;
  int RetValue;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pMiterPart;
  Abc_Ntk_t *pMiter;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  int fVerbose_local;
  int nPartSize_local;
  int nSeconds_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pMiter = (Abc_Ntk_t *)&pParams;
  Params.nTotalInspectsMade._4_4_ = fVerbose;
  Prove_ParamsSetDefault((Prove_Params_t *)pMiter);
  *(undefined4 *)&pMiter->pSpec = 5;
  if (nPartSize < 1) {
    __assert_fail("nPartSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x10b,"void Abc_NtkCecFraigPart(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int)");
  }
  pMiterPart = Abc_NtkMiter(pNtk1,pNtk2,1,nPartSize,0,0);
  if (pMiterPart == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.\n");
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pMiterPart);
    if (iVar1 == 0) {
      printf("Networks are NOT EQUIVALENT after structural hashing.\n");
      piVar3 = Abc_NtkVerifyGetCleanModel(pMiterPart,1);
      pMiterPart->pModel = piVar3;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,pMiterPart->pModel);
      if (pMiterPart->pModel != (int *)0x0) {
        free(pMiterPart->pModel);
        pMiterPart->pModel = (int *)0x0;
      }
      Abc_NtkDelete(pMiterPart);
    }
    else if (iVar1 == 1) {
      printf("Networks are equivalent after structural hashing.\n");
      Abc_NtkDelete(pMiterPart);
    }
    else {
      pAVar4 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar4,"unset progressbar");
      pSimInfo._4_4_ = 1;
      pSimInfo._0_4_ = 0;
      for (Status = 0; iVar1 = Abc_NtkPoNum(pMiterPart), Status < iVar1; Status = Status + 1) {
        pAVar5 = Abc_NtkPo(pMiterPart,Status);
        pAVar6 = Abc_ObjFanin0(pAVar5);
        pAVar7 = Abc_AigConst1(pMiterPart);
        pNtk = pMiterPart;
        if (pAVar6 == pAVar7) {
          iVar1 = Abc_ObjFaninC0(pAVar5);
          nOutputs = (int)(iVar1 != 0);
          pObj = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar6 = Abc_ObjFanin0(pAVar5);
          pNodeName = Abc_ObjName(pAVar5);
          pObj = (Abc_Obj_t *)Abc_NtkCreateCone(pNtk,pAVar6,pNodeName,0);
          iVar1 = Abc_ObjFaninC0(pAVar5);
          if (iVar1 != 0) {
            pAVar5 = Abc_NtkPo((Abc_Ntk_t *)pObj,0);
            Abc_ObjXorFaninC(pAVar5,0);
          }
          nOutputs = Abc_NtkIvyProve((Abc_Ntk_t **)&pObj,pMiter);
        }
        if (nOutputs == -1) {
          printf("Networks are undecided (resource limits is reached).\r");
          pSimInfo._4_4_ = -1;
        }
        else {
          if (nOutputs == 0) {
            piVar3 = Abc_NtkVerifySimulatePattern((Abc_Ntk_t *)pObj,*(int **)&pObj[4].Id);
            if (*piVar3 == 1) {
              printf("Networks are NOT EQUIVALENT.                 \n");
            }
            else {
              printf("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
            }
            if (piVar3 != (int *)0x0) {
              free(piVar3);
            }
            pSimInfo._4_4_ = 0;
            break;
          }
          uVar2 = Abc_NtkPoNum(pMiterPart);
          printf("Finished part %5d (out of %5d)\r",(ulong)(Status + 1),(ulong)uVar2);
          pSimInfo._0_4_ = nPartSize + (uint)pSimInfo;
        }
        if (pObj != (Abc_Obj_t *)0x0) {
          Abc_NtkDelete((Abc_Ntk_t *)pObj);
        }
      }
      pAVar4 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar4,"set progressbar");
      if (pSimInfo._4_4_ == 1) {
        printf("Networks are equivalent.                         \n");
      }
      else if (pSimInfo._4_4_ == -1) {
        uVar2 = Abc_NtkCoNum(pNtk1);
        printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)(uint)pSimInfo,
               (ulong)uVar2);
      }
      Abc_NtkDelete(pMiterPart);
    }
  }
  return;
}

Assistant:

void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    Abc_Obj_t * pObj;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    assert( nPartSize > 0 );

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, nPartSize, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // solve the problem iteratively for each output of the miter
    Status = 1;
    nOutputs = 0;
    Abc_NtkForEachPo( pMiter, pObj, i )
    {
        if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pMiter) )
        {
            if ( Abc_ObjFaninC0(pObj) ) // complemented -> const 0
                RetValue = 1;
            else
                RetValue = 0;
            pMiterPart = NULL;
        }
        else
        {
            // get the cone of this output
            pMiterPart = Abc_NtkCreateCone( pMiter, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 0 );
            if ( Abc_ObjFaninC0(pObj) )
                Abc_ObjXorFaninC( Abc_NtkPo(pMiterPart,0), 0 );
            // solve the cone
        //    RetValue = Abc_NtkMiterProve( &pMiterPart, pParams );
            RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        }

        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            break;
        }
        else
        {
            printf( "Finished part %5d (out of %5d)\r", i+1, Abc_NtkPoNum(pMiter) );
            nOutputs += nPartSize;
        }
//        if ( pMiter->pModel )
//            Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        if ( pMiterPart )
            Abc_NtkDelete( pMiterPart );
    }
  
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}